

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::FBXImporter::CanRead(FBXImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  char *tokens [1];
  char *local_70;
  size_t local_68;
  char local_60 [16];
  string local_50;
  
  BaseImporter::GetExtension(&local_50,pFile);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fbx","");
  pcVar1 = local_70;
  if (local_50._M_string_length == local_68) {
    if (local_50._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp(local_50._M_dataplus._M_p,local_70,local_50._M_string_length);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (pcVar1 != local_60) {
    operator_delete(pcVar1);
  }
  bVar2 = true;
  if (bVar4) goto LAB_00165b7b;
  if (local_50._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_00165b49;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_00165b49:
    local_70 = "fbx";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_70,1,200,false,false);
    goto LAB_00165b7b;
  }
  bVar2 = false;
LAB_00165b7b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool FBXImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == std::string( desc.mFileExtensions ) ) {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        // at least ASCII-FBX files usually have a 'FBX' somewhere in their head
        const char* tokens[] = {"fbx"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}